

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

void ncnn::copy_cut_border_image<unsigned_short>(Mat *src,Mat *dst,int top,int left)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  void *__dest;
  int iVar6;
  void *__src;
  
  uVar1 = dst->w;
  uVar2 = (ulong)src->w;
  __src = (void *)((long)src->data + (long)left * 2 + (long)top * uVar2 * src->elemsize);
  __dest = dst->data;
  iVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  iVar6 = dst->h;
  if (dst->h < 1) {
    iVar6 = 0;
  }
  for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
    if ((int)uVar1 < 0xc) {
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        *(undefined2 *)((long)__dest + uVar3 * 2) = *(undefined2 *)((long)__src + uVar3 * 2);
      }
    }
    else {
      memcpy(__dest,__src,(ulong)uVar1 * 2);
      uVar2 = (ulong)(uint)src->w;
    }
    __dest = (void *)((long)__dest + (long)(int)uVar1 * 2);
    __src = (void *)((long)__src + (long)(int)uVar2 * 2);
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src.row<T>(top) + left;
    T* outptr = dst; //.data;

    for (int y = 0; y < h; y++)
    {
        if (w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w * sizeof(T));
        }
        outptr += w;
        ptr += src.w;
    }
}